

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_def.c
# Opt level: O0

_Bool upb_FileDef_Resolves(upb_FileDef *f,char *path)

{
  _Bool _Var1;
  int iVar2;
  upb_FileDef *f_00;
  upb_FileDef *dep;
  int i;
  char *path_local;
  upb_FileDef *f_local;
  
  iVar2 = strcmp(f->name,path);
  if (iVar2 == 0) {
    f_local._7_1_ = true;
  }
  else {
    for (dep._4_4_ = 0; iVar2 = upb_FileDef_PublicDependencyCount(f), dep._4_4_ < iVar2;
        dep._4_4_ = dep._4_4_ + 1) {
      f_00 = upb_FileDef_PublicDependency(f,dep._4_4_);
      _Var1 = upb_FileDef_Resolves(f_00,path);
      if (_Var1) {
        return true;
      }
    }
    f_local._7_1_ = false;
  }
  return f_local._7_1_;
}

Assistant:

bool upb_FileDef_Resolves(const upb_FileDef* f, const char* path) {
  if (!strcmp(f->name, path)) return true;

  for (int i = 0; i < upb_FileDef_PublicDependencyCount(f); i++) {
    const upb_FileDef* dep = upb_FileDef_PublicDependency(f, i);
    if (upb_FileDef_Resolves(dep, path)) return true;
  }
  return false;
}